

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::ActivationLayer::outputInplace(ActivationLayer *this,Array *inputs)

{
  anon_class_8_1_1722cad4 __unary_op;
  element_type *this_00;
  size_t sVar1;
  element_type *this_01;
  float *__first;
  float *__last;
  float *__result;
  Activation *activation;
  Array *outputs;
  Array *inputs_local;
  ActivationLayer *this_local;
  
  this_00 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_ABackpropLayer).shared.outputBuffer);
  sVar1 = std::valarray<float>::size(this_00);
  if (sVar1 != this->nSize) {
    std::valarray<float>::resize(this_00,this->nSize,0.0);
  }
  this_01 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_ABackpropLayer).shared);
  std::valarray<float>::operator=(this_01,inputs);
  __unary_op.activation = this->activationFunction;
  __first = std::begin<float>(inputs);
  __last = std::end<float>(inputs);
  __result = std::begin<float>(this_00);
  ::std::
  transform<float_const*,float*,notch::core::ActivationLayer::outputInplace(std::valarray<float>const&)::_lambda(float)_1_>
            (__first,__last,__result,__unary_op);
  return;
}

Assistant:

virtual void outputInplace(const Array &inputs) {
        Array &outputs = *shared.outputBuffer;
        if (outputs.size() != nSize) {
            outputs.resize(nSize);
        }
        *shared.inputBuffer = inputs;
        auto &activation = (*activationFunction);
        std::transform(
            std::begin(inputs), std::end(inputs),
            std::begin(outputs),
            [&](float y) { return activation(y); });
    }